

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

ssize_t get_line_size(char *b,ssize_t avail,ssize_t *nlsize)

{
  char cVar1;
  ssize_t len;
  ssize_t *nlsize_local;
  ssize_t avail_local;
  char *b_local;
  
  len = 0;
  b_local = b;
  while( true ) {
    if (avail <= len) {
      if (nlsize != (ssize_t *)0x0) {
        *nlsize = 0;
      }
      return avail;
    }
    cVar1 = *b_local;
    if (cVar1 == '\0') {
      if (nlsize != (ssize_t *)0x0) {
        *nlsize = 0;
      }
      return -1;
    }
    if (cVar1 == '\n') break;
    if (cVar1 == '\r') {
      if ((1 < avail - len) && (b_local[1] == '\n')) {
        if (nlsize != (ssize_t *)0x0) {
          *nlsize = 2;
        }
        return len + 2;
      }
      break;
    }
    b_local = b_local + 1;
    len = len + 1;
  }
  if (nlsize != (ssize_t *)0x0) {
    *nlsize = 1;
  }
  return len + 1;
}

Assistant:

static ssize_t
get_line_size(const char *b, ssize_t avail, ssize_t *nlsize)
{
	ssize_t len;

	len = 0;
	while (len < avail) {
		switch (*b) {
		case '\0':/* Non-ascii character or control character. */
			if (nlsize != NULL)
				*nlsize = 0;
			return (-1);
		case '\r':
			if (avail-len > 1 && b[1] == '\n') {
				if (nlsize != NULL)
					*nlsize = 2;
				return (len+2);
			}
			/* FALL THROUGH */
		case '\n':
			if (nlsize != NULL)
				*nlsize = 1;
			return (len+1);
		default:
			b++;
			len++;
			break;
		}
	}
	if (nlsize != NULL)
		*nlsize = 0;
	return (avail);
}